

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O0

void * uo_base64_decode(void *dst,char *src,size_t src_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  bool bVar6;
  uchar a3;
  uchar a2;
  uchar a1;
  uchar a0;
  uchar *end;
  uchar *a;
  uchar *b;
  size_t src_len_local;
  char *src_local;
  void *dst_local;
  
  end = (uchar *)src;
  a = (uchar *)dst;
  while( true ) {
    bVar6 = true;
    if ((src + src_len <= end + 4) && (bVar6 = false, end[2] != '=')) {
      bVar6 = end[3] != '=';
    }
    if (!bVar6) break;
    bVar3 = *end;
    bVar4 = atob[end[1]];
    pbVar5 = end + 3;
    bVar1 = atob[end[2]];
    end = end + 4;
    bVar2 = atob[*pbVar5];
    *a = atob[bVar3] << 2 | (byte)((int)(uint)bVar4 >> 4);
    pbVar5 = a + 2;
    a[1] = bVar4 << 4 | (byte)((int)(uint)bVar1 >> 2);
    a = a + 3;
    *pbVar5 = bVar1 << 6 | bVar2;
  }
  pbVar5 = a;
  if (end < src + src_len) {
    bVar3 = atob[end[1]];
    bVar4 = atob[end[2]];
    *a = atob[*end] << 2 | (byte)((int)(uint)bVar3 >> 4);
    pbVar5 = a + 1;
    if (bVar4 != 0x40) {
      a[1] = bVar3 << 4 | (byte)((int)(uint)bVar4 >> 2);
      pbVar5 = a + 2;
    }
  }
  a = pbVar5;
  return a;
}

Assistant:

void *uo_base64_decode(
    void *dst, 
    const char *src, 
    size_t src_len)
{
    unsigned char *b = (unsigned char *)dst;
    const unsigned char *a = (unsigned char *)src;
    const unsigned char *end = a + src_len;
    unsigned char a0, a1, a2, a3;

    while (a + 4 < end || a[2] != '=' && a[3] != '=')
    {
        a0 = atob[*a++];
        a1 = atob[*a++];
        a2 = atob[*a++];
        a3 = atob[*a++];

        *b++ = a0 << 2 | a1 >> 4;
        *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
        *b++ = (a2 & 0x03) << 6 | a3;
    }

    if (a < end)
    {
        a0 = atob[*a++];
        a1 = atob[*a++];
        a2 = atob[*a++];

        *b++ = a0 << 2 | a1 >> 4;

        if (a2 != (unsigned char)0x40)
            *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
    }

    return b;
}